

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

unique_ptr<pg::Game,_std::default_delete<pg::Game>_> __thiscall
pg::Game::extract_subgame
          (Game *this,bitset *mask,vector<int,_std::allocator<int>_> *subgame_to_game)

{
  pointer piVar1;
  string *psVar2;
  long lVar3;
  Game *pGVar4;
  size_t sVar5;
  mapped_type_conflict *pmVar6;
  ostream *poVar7;
  vector<int,_std::allocator<int>_> *in_RCX;
  ulong uVar8;
  _Rb_tree_color *p_Var9;
  string *label;
  int iVar10;
  int *piVar11;
  bool bVar12;
  ulong uVar13;
  int w;
  long lVar14;
  key_type_conflict1 *__k;
  int ne;
  int nv;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> game_to_subgame;
  value_type_conflict3 local_d0;
  allocator<char> local_c9;
  Game *local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  vector<int,_std::allocator<int>_> *local_b0;
  Game *local_a8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_a0;
  string local_70;
  string local_50;
  
  local_b0 = in_RCX;
  sVar5 = bitset::count((bitset *)subgame_to_game);
  local_b4 = (int)sVar5;
  local_b8 = 0;
  piVar1 = (subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  iVar10 = 0;
  do {
    local_c8 = (Game *)mask;
    if (uVar8 == (~((long)mask->_bits >> 0x3f) & (ulong)mask->_bits)) {
      std::make_unique<pg::Game,int&,int&>((int *)this,&local_b4);
      local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a0._M_impl.super__Rb_tree_header._M_header;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d0 = 0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (local_b0,(size_type)local_c8->n_vertices,&local_d0);
      iVar10 = 0;
      for (local_d0 = 0; uVar8 = (ulong)local_d0, (long)uVar8 < (long)local_c8->n_vertices;
          local_d0 = local_d0 + 1) {
        if ((*(ulong *)((subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + (uVar8 >> 6) * 2) >> (uVar8 & 0x3f) & 1)
            != 0) {
          (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar10] = local_d0;
          pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_a0,&local_d0);
          *pmVar6 = iVar10;
          local_c0 = iVar10 + 1;
          uVar13 = (ulong)local_d0;
          local_a8 = (Game *)this->n_vertices;
          psVar2 = *(string **)(((bitset *)((long)local_c8 + 0x20))->_allocsize + uVar13 * 8);
          local_bc = *(int *)((long)local_c8->_priority + uVar13 * 4);
          uVar8 = *(ulong *)(*(size_t *)&local_c8->_owner + (uVar13 >> 6) * 8);
          if (psVar2 == (string *)0x0) {
            label = &local_70;
            std::__cxx11::string::string<std::allocator<char>>((string *)label,"",&local_c9);
            init_vertex(local_a8,iVar10,local_bc,(uint)((uVar8 >> (uVar13 & 0x3f) & 1) != 0),label);
          }
          else {
            label = &local_50;
            std::__cxx11::string::string((string *)label,psVar2);
            init_vertex(local_a8,iVar10,local_bc,(uint)((uVar8 >> (uVar13 & 0x3f) & 1) != 0),label);
          }
          std::__cxx11::string::~string((string *)label);
          iVar10 = local_c0;
        }
      }
      for (lVar14 = 0; lVar14 < local_b4; lVar14 = lVar14 + 1) {
        lVar3 = this->n_vertices;
        iVar10 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        *(undefined4 *)(*(long *)(lVar3 + 0x48) + lVar14 * 4) = *(undefined4 *)(lVar3 + 0x90);
        *(undefined4 *)(*(long *)(lVar3 + 0x50) + lVar14 * 4) = 0;
        for (__k = (key_type_conflict1 *)
                   ((long)*(int *)(((bitset *)((long)local_c8 + 0x40))->_size + (long)iVar10 * 4) *
                    4 + (long)((bitset *)((long)local_c8 + 0x40))->_bits); uVar8 = (ulong)*__k,
            uVar8 != 0xffffffffffffffff; __k = __k + 1) {
          if ((*(ulong *)((subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + (uVar8 >> 6) * 2) >> (uVar8 & 0x3f) & 1
              ) != 0) {
            pGVar4 = (Game *)this->n_vertices;
            pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_a0,__k);
            e_add(pGVar4,(int)lVar14,*pmVar6);
          }
        }
        e_finish((Game *)this->n_vertices);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_a0);
      return (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)
             (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)this;
    }
    if ((*(ulong *)(piVar1 + (uVar8 >> 6) * 2) >> (uVar8 & 0x3f) & 1) != 0) {
      bVar12 = true;
      for (piVar11 = (int *)((long)mask[2]._bits + (long)*(int *)(mask[2]._size + uVar8 * 4) * 4);
          uVar13 = (ulong)*piVar11, uVar13 != 0xffffffffffffffff; piVar11 = piVar11 + 1) {
        if ((*(ulong *)(piVar1 + (uVar13 >> 6) * 2) >> (uVar13 & 0x3f) & 1) != 0) {
          iVar10 = iVar10 + 1;
          bVar12 = false;
          local_b8 = iVar10;
        }
      }
      if (bVar12) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"no successor for vertex ");
        pGVar4 = local_c8;
        local_a0._M_impl._0_8_ = local_c8;
        local_a0._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar8;
        poVar7 = operator<<(poVar7,(_label_vertex *)&local_a0);
        poVar7 = std::operator<<(poVar7," in extract_subgame!");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::operator<<((ostream *)&std::cerr,"successors not in subgame:");
        for (p_Var9 = (_Rb_tree_color *)(pGVar4->_outedges + pGVar4->_firstouts[uVar8]);
            *p_Var9 != ~_S_red; p_Var9 = p_Var9 + 1) {
          poVar7 = std::operator<<((ostream *)&std::cerr," ");
          local_a0._M_impl.super__Rb_tree_header._M_header._M_color = *p_Var9;
          local_a0._M_impl._0_8_ = local_c8;
          operator<<(poVar7,(_label_vertex *)&local_a0);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        abort();
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<Game>
Game::extract_subgame(const bitset& mask, std::vector<int>& subgame_to_game)
{
    // check if there are any dead ends (not allowed)
    // also count the number of edges in the subgame

    int nv = mask.count();
    int ne = 0;
    for (int v=0; v<n_vertices; v++) {
        if (mask[v]) {
            bool bad = true;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                if (mask[*curedge]) {
                    bad = false;
                    ne++;
                }
            }
            if (bad) {
                std::cerr << "no successor for vertex " << label_vertex(v) << " in extract_subgame!" << std::endl;
                std::cerr << "successors not in subgame:";
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    std::cerr << " " << label_vertex(*curedge);
                }
                std::cerr << std::endl;
                abort(); // bad!
            }
        }
    }

    auto res = std::make_unique<Game>(nv, ne);

    // create mapping from game to subgame
    // also count the number of vertices in the subgame
    std::map<int, int> game_to_subgame;
    subgame_to_game.assign(n_vertices, 0);

    int vertices = 0;
    for (int v=0; v<n_vertices; v++) {
        if (!mask[v]) continue;

        // update game_to_subgame and subgame_to_game
        int w = vertices++;
        subgame_to_game[w] = v;
        game_to_subgame[v] = w;

        // initialize most stuff (except edges)
        if (_label[v] != 0) res->init_vertex(w, _priority[v], _owner[v], *_label[v]);
        else res->init_vertex(w, _priority[v], _owner[v], "");
    }

    // now add all edges

    for (int w=0; w<nv; w++) {
        int v = subgame_to_game[w];
        res->e_start(w);
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            if (mask[*curedge]) res->e_add(w, game_to_subgame[*curedge]);
        }
        res->e_finish();
    }

    // TODO: fix is_ordered?

    return res;
}